

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

U32 ZSTD_window_correctOverflow(ZSTD_window_t *window,U32 cycleLog,U32 maxDist,void *src)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = 1 << ((byte)cycleLog & 0x1f);
  uVar1 = (int)src - (int)window->base;
  uVar5 = uVar3 - 1 & uVar1;
  uVar2 = 2;
  if (2 < uVar3) {
    uVar2 = uVar3;
  }
  uVar4 = 0;
  if (uVar5 < 2) {
    uVar4 = uVar2;
  }
  uVar2 = uVar3;
  if (uVar3 <= maxDist) {
    uVar2 = maxDist;
  }
  if ((maxDist & maxDist - 1) != 0) {
    __assert_fail("(maxDist & (maxDist - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4834,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  uVar4 = uVar2 + uVar5 + uVar4;
  if (uVar5 != (uVar3 - 1 & uVar4)) {
    __assert_fail("(curr & cycleMask) == (newCurrent & cycleMask)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4835,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  if (uVar1 <= uVar4) {
    __assert_fail("curr > newCurrent",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4836,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  uVar1 = uVar1 - uVar4;
  if (uVar1 < 0x10000001) {
    __assert_fail("correction > 1<<28",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4839,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  window->base = window->base + uVar1;
  window->dictBase = window->dictBase + uVar1;
  uVar2 = window->lowLimit - uVar1;
  if (window->lowLimit < uVar1 + 2) {
    uVar2 = 2;
  }
  uVar3 = window->dictLimit - uVar1;
  if (window->dictLimit < uVar1 + 2) {
    uVar3 = 2;
  }
  window->lowLimit = uVar2;
  window->dictLimit = uVar3;
  if (uVar4 < maxDist) {
    __assert_fail("newCurrent >= maxDist",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x484a,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  if (uVar4 - maxDist < 2) {
    __assert_fail("newCurrent - maxDist >= ZSTD_WINDOW_START_INDEX",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x484b,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  if (uVar2 <= uVar4) {
    if (uVar3 <= uVar4) {
      window->nbOverflowCorrections = window->nbOverflowCorrections + 1;
      return uVar1;
    }
    __assert_fail("window->dictLimit <= newCurrent",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x484e,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                 );
  }
  __assert_fail("window->lowLimit <= newCurrent",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x484d,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
}

Assistant:

MEM_STATIC U32 ZSTD_window_correctOverflow(ZSTD_window_t* window, U32 cycleLog,
                                           U32 maxDist, void const* src)
{
    /* preemptive overflow correction:
     * 1. correction is large enough:
     *    lowLimit > (3<<29) ==> current > 3<<29 + 1<<windowLog
     *    1<<windowLog <= newCurrent < 1<<chainLog + 1<<windowLog
     *
     *    current - newCurrent
     *    > (3<<29 + 1<<windowLog) - (1<<windowLog + 1<<chainLog)
     *    > (3<<29) - (1<<chainLog)
     *    > (3<<29) - (1<<30)             (NOTE: chainLog <= 30)
     *    > 1<<29
     *
     * 2. (ip+ZSTD_CHUNKSIZE_MAX - cctx->base) doesn't overflow:
     *    After correction, current is less than (1<<chainLog + 1<<windowLog).
     *    In 64-bit mode we are safe, because we have 64-bit ptrdiff_t.
     *    In 32-bit mode we are safe, because (chainLog <= 29), so
     *    ip+ZSTD_CHUNKSIZE_MAX - cctx->base < 1<<32.
     * 3. (cctx->lowLimit + 1<<windowLog) < 1<<32:
     *    windowLog <= 31 ==> 3<<29 + 1<<windowLog < 7<<29 < 1<<32.
     */
    U32 const cycleSize = 1u << cycleLog;
    U32 const cycleMask = cycleSize - 1;
    U32 const curr = (U32)((BYTE const*)src - window->base);
    U32 const currentCycle = curr & cycleMask;
    /* Ensure newCurrent - maxDist >= ZSTD_WINDOW_START_INDEX. */
    U32 const currentCycleCorrection = currentCycle < ZSTD_WINDOW_START_INDEX
                                     ? MAX(cycleSize, ZSTD_WINDOW_START_INDEX)
                                     : 0;
    U32 const newCurrent = currentCycle
                         + currentCycleCorrection
                         + MAX(maxDist, cycleSize);
    U32 const correction = curr - newCurrent;
    /* maxDist must be a power of two so that:
     *   (newCurrent & cycleMask) == (curr & cycleMask)
     * This is required to not corrupt the chains / binary tree.
     */
    assert((maxDist & (maxDist - 1)) == 0);
    assert((curr & cycleMask) == (newCurrent & cycleMask));
    assert(curr > newCurrent);
    if (!ZSTD_WINDOW_OVERFLOW_CORRECT_FREQUENTLY) {
        /* Loose bound, should be around 1<<29 (see above) */
        assert(correction > 1<<28);
    }

    window->base += correction;
    window->dictBase += correction;
    if (window->lowLimit < correction + ZSTD_WINDOW_START_INDEX) {
        window->lowLimit = ZSTD_WINDOW_START_INDEX;
    } else {
        window->lowLimit -= correction;
    }
    if (window->dictLimit < correction + ZSTD_WINDOW_START_INDEX) {
        window->dictLimit = ZSTD_WINDOW_START_INDEX;
    } else {
        window->dictLimit -= correction;
    }

    /* Ensure we can still reference the full window. */
    assert(newCurrent >= maxDist);
    assert(newCurrent - maxDist >= ZSTD_WINDOW_START_INDEX);
    /* Ensure that lowLimit and dictLimit didn't underflow. */
    assert(window->lowLimit <= newCurrent);
    assert(window->dictLimit <= newCurrent);

    ++window->nbOverflowCorrections;

    DEBUGLOG(4, "Correction of 0x%x bytes to lowLimit=0x%x", correction,
             window->lowLimit);
    return correction;
}